

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-init.c
# Opt level: O2

void textui_init(void)

{
  uint32_t local_28 [8];
  
  event_signal_message(EVENT_INITSTATUS,L'\0',"Loading basic pref file...");
  process_pref_file("pref.prf",false,false);
  if (play_again == false) {
    cmd_init();
    textui_knowledge_init();
    textui_input_init();
    textui_prefs_init();
    screen_save_depth = screen_save_depth + 1;
    if (angband_term[0] == (term *)0x0) {
      quit("Main window does not exist");
    }
    Term_activate(angband_term[0]);
    if ((Term->hgt < 0x18) || (Term->wid < 0x50)) {
      plog("Main window is too small - please make it bigger.");
    }
    Term_set_cursor(false);
    Term_xtra(L'\n',L'\0');
    Term_redraw_all();
  }
  else {
    textui_knowledge_cleanup();
    textui_knowledge_init();
  }
  window_flag[4] = 0;
  window_flag[5] = 0;
  window_flag[6] = 0;
  window_flag[7] = 0;
  window_flag[0] = 0;
  window_flag[1] = 0;
  window_flag[2] = 0;
  window_flag[3] = 0;
  local_28[0] = 0;
  local_28[1] = 0x40;
  local_28[2] = 1;
  local_28[3] = 0x400;
  local_28[4] = 0x1000;
  local_28[5] = 0x300;
  local_28[6] = 0x80;
  local_28[7] = 0x10;
  subwindows_set_flags(local_28,8);
  event_signal_message(EVENT_INITSTATUS,L'\0',"Initialization complete");
  return;
}

Assistant:

void textui_init(void)
{
	uint32_t default_window_flag[ANGBAND_TERM_MAX];

	/* Initialize graphics info and basic pref data */
	event_signal_message(EVENT_INITSTATUS, 0, "Loading basic pref file...");
	(void)process_pref_file("pref.prf", false, false);

	if (!play_again) {
		/* Sneakily init command list */
		cmd_init();

		/* Initialize knowledge things */
		textui_knowledge_init();

		/* Initialize input hooks */
		textui_input_init();

		/* Initialize visual prefs */
		textui_prefs_init();

		/* Hack -- Increase "icky" depth */
		screen_save_depth++;

		/* Verify main term */
		if (!term_screen)
			quit("Main window does not exist");

		/* Make sure main term is active */
		Term_activate(term_screen);

		/* Verify minimum size */
		if ((Term->hgt < 24) || (Term->wid < 80))
			plog("Main window is too small - please make it bigger.");

		/* Hack -- Turn off the cursor */
		(void)Term_set_cursor(false);

		/* Update terminals for preference changes. */
		(void) Term_xtra(TERM_XTRA_REACT, 0);
		(void) Term_redraw_all();
	} else {
		/* Redo knowledge initialization. */
		textui_knowledge_cleanup();
		textui_knowledge_init();
	}

	/* initialize window options that will be overridden by the savefile */
	memset(window_flag, 0, sizeof(uint32_t)*ANGBAND_TERM_MAX);
	memset(default_window_flag, 0, sizeof default_window_flag);
	if (ANGBAND_TERM_MAX > 1) default_window_flag[1] = (PW_MESSAGE);
	if (ANGBAND_TERM_MAX > 2) default_window_flag[2] = (PW_INVEN);
	if (ANGBAND_TERM_MAX > 3) default_window_flag[3] = (PW_MONLIST);
	if (ANGBAND_TERM_MAX > 4) default_window_flag[4] = (PW_ITEMLIST);
	if (ANGBAND_TERM_MAX > 5) default_window_flag[5] = (PW_MONSTER | PW_OBJECT);
	if (ANGBAND_TERM_MAX > 6) default_window_flag[6] = (PW_OVERHEAD);
	if (ANGBAND_TERM_MAX > 7) default_window_flag[7] = (PW_PLAYER_2);

	/* Set up the subwindows */
	subwindows_set_flags(default_window_flag, ANGBAND_TERM_MAX);

	/* Done */
	event_signal_message(EVENT_INITSTATUS, 0, "Initialization complete");
}